

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O1

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CExpStatement *statement)

{
  CStatement *pCVar1;
  CExpression *pCVar2;
  CExpStatement *this_00;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_18;
  
  pCVar2 = CExpStatement::Expression(statement);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  this_00 = (CExpStatement *)operator_new(0x10);
  local_18._M_head_impl =
       (this->childExpression)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  CExpStatement::CExpStatement
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_18);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)this_00;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if (local_18._M_head_impl != (CExpression *)0x0) {
    (*((local_18._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CExpStatement &statement) {
    statement.Expression()->Accept(*this);

    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CExpStatement(std::move(childExpression))
            )
    );
}